

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_example.cpp
# Opt level: O1

int main(void)

{
  uint uVar1;
  int iVar2;
  EGLint EVar3;
  EGLBoolean EVar4;
  undefined1 *puVar5;
  EGLDisplay pvVar6;
  EGLSurface pvVar7;
  EGLContext pvVar8;
  GLubyte *pGVar9;
  uchar *in;
  undefined8 extraout_RAX;
  pointer unaff_R12;
  long lVar10;
  EGLint num_devices;
  int minor;
  int major;
  EGLint egl_pbuffer_attribs [5];
  EGLint egl_config_attribs [13];
  EGLDeviceEXT egl_devices [32];
  EGLint local_1c0;
  EGLint local_1bc;
  string local_1b8;
  EGLint local_198 [8];
  EGLint local_178 [16];
  EGLDeviceEXT local_138 [33];
  
  local_178[8] = 0x3033;
  local_178[9] = 1;
  local_178[10] = 0x3040;
  local_178[0xb] = 8;
  local_178[4] = 0x3022;
  local_178[5] = 8;
  local_178[6] = 0x3025;
  local_178[7] = 8;
  local_178[0] = 0x3024;
  local_178[1] = 8;
  local_178[2] = 0x3023;
  local_178[3] = 8;
  local_178[0xc] = 0x3038;
  local_198[0] = 0x3057;
  local_198[1] = 0x100;
  local_198[2] = 0x3056;
  local_198[3] = 0x100;
  local_198[4] = 0x3038;
  puVar5 = (undefined1 *)operator_new(0x38);
  *puVar5 = 0;
  *(undefined8 *)(puVar5 + 4) = 0;
  iVar2 = gladLoaderLoadEGL((EGLDisplay)0x0);
  if (iVar2 == 0) {
    main_cold_11();
LAB_0012b7e7:
    main_cold_10();
LAB_0012b7ec:
    main_cold_9();
LAB_0012b7f1:
    main_cold_8();
LAB_0012b7f6:
    main_cold_7();
LAB_0012b7fb:
    main_cold_2();
LAB_0012b800:
    main_cold_6();
LAB_0012b805:
    main_cold_5();
LAB_0012b80a:
    main_cold_4();
  }
  else {
    local_1c0 = 0;
    EVar3 = (*glad_eglGetError)();
    EVar4 = (*glad_eglQueryDevicesEXT)(0x20,local_138,&local_1c0);
    if ((EVar4 == 0) || (EVar3 != 0x3000)) {
      puts("eglQueryDevicesEXT Failed.");
      *(undefined8 *)(puVar5 + 0x30) = 0;
    }
    printf("number of devices found %d\n");
    uVar1 = *(uint *)(puVar5 + 0xc);
    if ((ulong)uVar1 == 0xffffffff) {
      if (0 < local_1c0) {
        lVar10 = 0;
        do {
          unaff_R12 = (pointer)(*glad_eglGetPlatformDisplayEXT)
                                         (0x313f,local_138[lVar10],(EGLint *)0x0);
          EVar3 = (*glad_eglGetError)();
          if ((EVar3 == 0x3000) && (unaff_R12 != (pointer)0x0)) {
            EVar4 = (*glad_eglInitialize)(unaff_R12,(EGLint *)&local_1b8,&local_1bc);
            EVar3 = (*glad_eglGetError)();
            if ((EVar3 == 0x3000) && (EVar4 == 1)) {
              *(pointer *)(puVar5 + 0x30) = unaff_R12;
            }
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < local_1c0);
      }
    }
    else {
      if (((int)uVar1 < 0) || (local_1c0 <= (int)uVar1)) goto LAB_0012b814;
      pvVar6 = (*glad_eglGetPlatformDisplayEXT)(0x313f,local_138[uVar1],(EGLint *)0x0);
      EVar3 = (*glad_eglGetError)();
      if ((EVar3 == 0x3000) && (pvVar6 != (EGLDisplay)0x0)) {
        EVar4 = (*glad_eglInitialize)(pvVar6,(EGLint *)&local_1b8,&local_1bc);
        EVar3 = (*glad_eglGetError)();
        if ((EVar3 == 0x3000) && (EVar4 == 1)) {
          *(EGLDisplay *)(puVar5 + 0x30) = pvVar6;
        }
      }
    }
    EVar4 = (*glad_eglInitialize)(*(EGLDisplay *)(puVar5 + 0x30),(EGLint *)0x0,(EGLint *)0x0);
    if (EVar4 == 0) goto LAB_0012b7e7;
    iVar2 = gladLoaderLoadEGL(*(EGLDisplay *)(puVar5 + 0x30));
    if (iVar2 == 0) goto LAB_0012b7ec;
    printf("Loaded EGL %d.%d after reload.\n",(ulong)(uint)(iVar2 / 10000),
           (ulong)(uint)(iVar2 % 10000));
    EVar4 = (*glad_eglBindAPI)(0x30a2);
    *(EGLBoolean *)(puVar5 + 0x10) = EVar4;
    if (EVar4 == 0) goto LAB_0012b7f1;
    EVar4 = (*glad_eglChooseConfig)
                      (*(EGLDisplay *)(puVar5 + 0x30),local_178,(EGLConfig *)(puVar5 + 0x18),1,
                       (EGLint *)(puVar5 + 0x14));
    *(EGLBoolean *)(puVar5 + 0x10) = EVar4;
    if (EVar4 == 0) goto LAB_0012b7f6;
    if (*(int *)(puVar5 + 0x14) != 1) goto LAB_0012b7fb;
    pvVar7 = (*glad_eglCreatePbufferSurface)
                       (*(EGLDisplay *)(puVar5 + 0x30),*(EGLConfig *)(puVar5 + 0x18),local_198);
    *(EGLSurface *)(puVar5 + 0x20) = pvVar7;
    if (pvVar7 == (EGLSurface)0x0) goto LAB_0012b800;
    pvVar8 = (*glad_eglCreateContext)
                       (*(EGLDisplay *)(puVar5 + 0x30),*(EGLConfig *)(puVar5 + 0x18),(EGLContext)0x0
                        ,(EGLint *)0x0);
    *(EGLContext *)(puVar5 + 0x28) = pvVar8;
    if (pvVar8 == (EGLContext)0x0) goto LAB_0012b805;
    EVar4 = (*glad_eglMakeCurrent)
                      (*(EGLDisplay *)(puVar5 + 0x30),*(EGLSurface *)(puVar5 + 0x20),
                       *(EGLSurface *)(puVar5 + 0x20),pvVar8);
    *(EGLBoolean *)(puVar5 + 0x10) = EVar4;
    if (EVar4 == 0) goto LAB_0012b80a;
    iVar2 = gladLoadGL((GLADloadfunc)glad_eglGetProcAddress);
    if (iVar2 != 0) {
      pGVar9 = (*glad_glGetString)(0x1f00);
      printf("GL_VENDOR=%s\n",pGVar9);
      pGVar9 = (*glad_glGetString)(0x1f01);
      printf("GL_RENDERER=%s\n",pGVar9);
      pGVar9 = (*glad_glGetString)(0x1f02);
      printf("GL_VERSION=%s\n",pGVar9);
      pGVar9 = (*glad_glGetString)(0x8b8c);
      printf("GL_SHADING_LANGUAGE_VERSION=%s\n",pGVar9);
      in = (uchar *)operator_new__(0x30000);
      (*glad_glClear)(0x4000);
      (*glad_glBegin)(4);
      (*glad_glColor3f)(1.0,0.0,0.0);
      (*glad_glVertex2f)(0.0,1.0);
      (*glad_glColor3f)(0.0,1.0,0.0);
      (*glad_glVertex2f)(-1.0,-1.0);
      (*glad_glColor3f)(0.0,0.0,1.0);
      (*glad_glVertex2f)(1.0,-1.0);
      (*glad_glEnd)();
      (*glad_eglSwapBuffers)(*(EGLDisplay *)(puVar5 + 0x30),*(EGLSurface *)(puVar5 + 0x20));
      (*glad_glReadPixels)(0,0,0x100,0x100,0x1907,0x1401,in);
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"test.png","");
      lodepng::encode(&local_1b8,in,0x100,0x100,LCT_RGB,8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      (*glad_eglTerminate)(*(EGLDisplay *)(puVar5 + 0x30));
      operator_delete(puVar5,0x38);
      operator_delete(in,1);
      return 0;
    }
  }
  main_cold_3();
LAB_0012b814:
  main_cold_1();
  if (local_1b8._M_dataplus._M_p != unaff_R12) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main(){


    int m_windowWidth;
    int m_windowHeight;
    int m_renderDevice;
    
    EGLBoolean success;
    EGLint num_configs;
    EGLConfig egl_config;
    EGLSurface egl_surface;
    EGLContext egl_context;
    EGLDisplay egl_display;
    
    m_windowWidth = 256;
    m_windowHeight = 256;
    m_renderDevice = -1;

    EGLint egl_config_attribs[] = {EGL_RED_SIZE,
        8,
        EGL_GREEN_SIZE,
        8,
        EGL_BLUE_SIZE,
        8,
        EGL_DEPTH_SIZE,
        8,
        EGL_SURFACE_TYPE,
        EGL_PBUFFER_BIT,
        EGL_RENDERABLE_TYPE,
        EGL_OPENGL_BIT,
        EGL_NONE};
    
    EGLint egl_pbuffer_attribs[] = {
        EGL_WIDTH, m_windowWidth, EGL_HEIGHT, m_windowHeight,
        EGL_NONE,
    };
    
    EGLInternalData2* m_data = new EGLInternalData2();

    // Load EGL functions
    int egl_version = gladLoaderLoadEGL(NULL);
    if(!egl_version) {
        fprintf(stderr, "failed to EGL with glad.\n");
        exit(EXIT_FAILURE);

    };

    // Query EGL Devices
    const int max_devices = 32;
    EGLDeviceEXT egl_devices[max_devices];
    EGLint num_devices = 0;
    EGLint egl_error = eglGetError();
    if (!eglQueryDevicesEXT(max_devices, egl_devices, &num_devices) ||
        egl_error != EGL_SUCCESS) {
        printf("eglQueryDevicesEXT Failed.\n");
        m_data->egl_display = EGL_NO_DISPLAY;
    }

    printf("number of devices found %d\n", num_devices);

    // Query EGL Screens
    if(m_data->m_renderDevice == -1) {
        // Chose default screen, by trying all
        for (EGLint i = 0; i < num_devices; ++i) {
            // Set display
            EGLDisplay display = eglGetPlatformDisplayEXT(EGL_PLATFORM_DEVICE_EXT,
                                                          egl_devices[i], NULL);
            if (eglGetError() == EGL_SUCCESS && display != EGL_NO_DISPLAY) {
                int major, minor;
                EGLBoolean initialized = eglInitialize(display, &major, &minor);
                if (eglGetError() == EGL_SUCCESS && initialized == EGL_TRUE) {
                    m_data->egl_display = display;
                }
            }
        }
    } else {
        // Chose specific screen, by using m_renderDevice
        if (m_data->m_renderDevice < 0 || m_data->m_renderDevice >= num_devices) {
            fprintf(stderr, "Invalid render_device choice: %d < %d.\n", m_data->m_renderDevice, num_devices);
            exit(EXIT_FAILURE);
        }

        // Set display
        EGLDisplay display = eglGetPlatformDisplayEXT(EGL_PLATFORM_DEVICE_EXT,
                                                      egl_devices[m_data->m_renderDevice], NULL);
        if (eglGetError() == EGL_SUCCESS && display != EGL_NO_DISPLAY) {
            int major, minor;
            EGLBoolean initialized = eglInitialize(display, &major, &minor);
            if (eglGetError() == EGL_SUCCESS && initialized == EGL_TRUE) {
                m_data->egl_display = display;
            }
        }
    }

    if (!eglInitialize(m_data->egl_display, NULL, NULL)) {
        fprintf(stderr, "Unable to initialize EGL\n");
        exit(EXIT_FAILURE);
    }

    egl_version = gladLoaderLoadEGL(m_data->egl_display);
    if (!egl_version) {
        fprintf(stderr, "Unable to reload EGL.\n");
        exit(EXIT_FAILURE);
    }
    printf("Loaded EGL %d.%d after reload.\n", GLAD_VERSION_MAJOR(egl_version),
           GLAD_VERSION_MINOR(egl_version));


    m_data->success = eglBindAPI(EGL_OPENGL_API);
    if (!m_data->success) {
        // TODO: Properly handle this error (requires change to default window
        // API to change return on all window types to bool).
        fprintf(stderr, "Failed to bind OpenGL API.\n");
        exit(EXIT_FAILURE);
    }

    m_data->success =
    eglChooseConfig(m_data->egl_display, egl_config_attribs,
                    &m_data->egl_config, 1, &m_data->num_configs);
    if (!m_data->success) {
        // TODO: Properly handle this error (requires change to default window
        // API to change return on all window types to bool).
        fprintf(stderr, "Failed to choose config (eglError: %d)\n", eglGetError());
        exit(EXIT_FAILURE);
    }
    if (m_data->num_configs != 1) {
        fprintf(stderr, "Didn't get exactly one config, but %d\n", m_data->num_configs);
        exit(EXIT_FAILURE);
    }

    m_data->egl_surface = eglCreatePbufferSurface(
                                                  m_data->egl_display, m_data->egl_config, egl_pbuffer_attribs);
    if (m_data->egl_surface == EGL_NO_SURFACE) {
        fprintf(stderr, "Unable to create EGL surface (eglError: %d)\n", eglGetError());
        exit(EXIT_FAILURE);
    }


    m_data->egl_context = eglCreateContext(
                                           m_data->egl_display, m_data->egl_config, EGL_NO_CONTEXT, NULL);
    if (!m_data->egl_context) {
        fprintf(stderr, "Unable to create EGL context (eglError: %d)\n",eglGetError());
        exit(EXIT_FAILURE);
    }

    m_data->success =
        eglMakeCurrent(m_data->egl_display, m_data->egl_surface, m_data->egl_surface,
                   m_data->egl_context);
    if (!m_data->success) {
        fprintf(stderr, "Failed to make context current (eglError: %d)\n", eglGetError());
        exit(EXIT_FAILURE);
    }

    if (!gladLoadGL(eglGetProcAddress)) {
        fprintf(stderr, "failed to load GL with glad.\n");
        exit(EXIT_FAILURE);
    }

    const GLubyte* ven = glGetString(GL_VENDOR);
    printf("GL_VENDOR=%s\n", ven);

    const GLubyte* ren = glGetString(GL_RENDERER);
    printf("GL_RENDERER=%s\n", ren);
    const GLubyte* ver = glGetString(GL_VERSION);
    printf("GL_VERSION=%s\n", ver);
    const GLubyte* sl = glGetString(GL_SHADING_LANGUAGE_VERSION);
    printf("GL_SHADING_LANGUAGE_VERSION=%s\n", sl);

    int size = 3 * m_windowWidth * m_windowHeight;
    unsigned char *data2 = new unsigned char[size];


    glClear(GL_COLOR_BUFFER_BIT);
    glBegin(GL_TRIANGLES);
    glColor3f(1, 0, 0);
    glVertex2f(0,  1);

    glColor3f(0, 1, 0);
    glVertex2f(-1, -1);

    glColor3f(0, 0, 1);
    glVertex2f(1, -1);
    glEnd();


    eglSwapBuffers( m_data->egl_display, m_data->egl_surface);
    glReadPixels(0,0,m_windowWidth,m_windowHeight,GL_RGB, GL_UNSIGNED_BYTE, data2);
    unsigned error = lodepng::encode("test.png", (unsigned char*)data2, m_windowWidth, m_windowHeight, LCT_RGB, 8);

    eglTerminate(m_data->egl_display);
    delete m_data;
    delete data2;
    return 0;
}